

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

char * bssl::anon_unknown_0::GetVersionName(uint16_t version)

{
  int iVar1;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,version);
  if (iVar1 < 0xfefc) {
    switch(iVar1) {
    case 0x301:
      return "TLSv1";
    case 0x302:
      return "TLSv1.1";
    case 0x303:
      return "TLSv1.2";
    case 0x304:
      return "TLSv1.3";
    }
  }
  else {
    if (iVar1 == 0xfefc) {
      return "DTLSv1.3";
    }
    if (iVar1 == 0xfefd) {
      return "DTLSv1.2";
    }
    if (iVar1 == 0xfeff) {
      return "DTLSv1";
    }
  }
  return "???";
}

Assistant:

static const char *GetVersionName(uint16_t version) {
  switch (version) {
    case TLS1_VERSION:
      return "TLSv1";
    case TLS1_1_VERSION:
      return "TLSv1.1";
    case TLS1_2_VERSION:
      return "TLSv1.2";
    case TLS1_3_VERSION:
      return "TLSv1.3";
    case DTLS1_VERSION:
      return "DTLSv1";
    case DTLS1_2_VERSION:
      return "DTLSv1.2";
    case DTLS1_3_VERSION:
      return "DTLSv1.3";
    default:
      return "???";
  }
}